

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseCFG.h
# Opt level: O3

void covenant::parse_rules<covenant::StrParse>(StrParse *input,CFG *g,NonTerminalMap *mapping)

{
  while( true ) {
    parse_rule<covenant::StrParse>(input,g,mapping);
    if (((input->str)._M_string_length <= (ulong)input->idx) ||
       ((input->str)._M_dataplus._M_p[input->idx] != ';')) break;
    StrParse::chomp(input);
    consume_blanks<covenant::StrParse>(input);
  }
  return;
}

Assistant:

void parse_rules(In& input, CFG &g, NonTerminalMap &mapping)
{

  char c = input.peek();
  parse_rule(input, g, mapping);
  
  if(input.empty())
    return;
  
  // Check if we continue parsing
  c = input.peek();
  switch(c)
  {
    case ';':
      // Another rule
      input.chomp();
      consume_blanks(input);
      parse_rules(input, g, mapping);
    default:
      break;
  }
  return;
}